

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg-ndfs.cc
# Opt level: O2

tuple<tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
* tchecker::tck_liveness::zg_ndfs::run
            (tuple<tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
             *__return_storage_ptr__,system_declaration_t *sysdecl,string *labels,size_t block_size,
            size_t table_size)

{
  bool bVar1;
  system_t *this;
  ostream *poVar2;
  zg_t *__p;
  graph_t *this_00;
  algorithm_t algorithm;
  shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t> graph;
  shared_ptr<tchecker::zg::zg_t> zg;
  shared_ptr<const_tchecker::ta::system_t> system;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> accepting_labels;
  stats_t stats;
  
  this = (system_t *)operator_new(0x480);
  ta::system_t::system_t(this,sysdecl);
  std::__shared_ptr<tchecker::ta::system_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::ta::system_t,void>
            ((__shared_ptr<tchecker::ta::system_t_const,(__gnu_cxx::_Lock_policy)2> *)&system,this);
  bVar1 = tchecker::system::every_process_has_initial_location
                    ((system_t *)
                     system.
                     super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (!bVar1) {
    poVar2 = tchecker::operator<<((ostream *)&std::cerr,(log_warning_t *)&log_warning);
    poVar2 = std::operator<<(poVar2,"system has no initial state");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  __p = tchecker::zg::factory
                  (&system,SHARING,ELAPSED_SEMANTICS,EXTRA_LU_PLUS_LOCAL,block_size,table_size);
  std::__shared_ptr<tchecker::zg::zg_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::zg::zg_t,void>
            ((__shared_ptr<tchecker::zg::zg_t,(__gnu_cxx::_Lock_policy)2> *)&zg,__p);
  this_00 = (graph_t *)operator_new(0x118);
  graph_t::graph_t(this_00,&zg,block_size,table_size);
  std::__shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,void>
            ((__shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,(__gnu_cxx::_Lock_policy)2> *)
             &graph,this_00);
  syncprod::system_t::labels
            (&accepting_labels,
             &(system.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_system_t,labels);
  algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::run
            (&stats,(algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *)
                    &algorithm,
             zg.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             graph.
             super___shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,&accepting_labels);
  std::__shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2> *
               )__return_storage_ptr__,
               &graph.
                super___shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2>
              );
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl._stored_states =
       stats._stored_states;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl._cycle =
       stats._cycle;
  *(undefined7 *)
   &(__return_storage_ptr__->
    super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
    ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.field_0x39 =
       stats._57_7_;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.
  _visited_transitions_blue = stats._visited_transitions_blue;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.
  _visited_transitions_red = stats._visited_transitions_red;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.
  _visited_states_blue = stats._visited_states_blue;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.
  _visited_states_red = stats._visited_states_red;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.super_stats_t.
  _start_time.__d.__r = (rep)stats.super_stats_t._start_time.__d.__r;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::ndfs::stats_t,_false>._M_head_impl.super_stats_t.
  _end_time.__d.__r = (rep)stats.super_stats_t._end_time.__d.__r;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            (&accepting_labels);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&graph.
              super___shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&zg.super___shared_ptr<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&system.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<tchecker::algorithms::ndfs::stats_t, std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>>
run(tchecker::parsing::system_declaration_t const & sysdecl, std::string const & labels, std::size_t block_size,
    std::size_t table_size)
{
  std::shared_ptr<tchecker::ta::system_t const> system{new tchecker::ta::system_t{sysdecl}};
  if (!tchecker::system::every_process_has_initial_location(system->as_system_system()))
    std::cerr << tchecker::log_warning << "system has no initial state" << std::endl;

  std::shared_ptr<tchecker::zg::zg_t> zg{tchecker::zg::factory(system, tchecker::ts::SHARING, tchecker::zg::ELAPSED_SEMANTICS,
                                                               tchecker::zg::EXTRA_LU_PLUS_LOCAL, block_size, table_size)};

  std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t> graph{
      new tchecker::tck_liveness::zg_ndfs::graph_t{zg, block_size, table_size}};

  boost::dynamic_bitset<> accepting_labels = system->as_syncprod_system().labels(labels);

  tchecker::tck_liveness::zg_ndfs::algorithm_t algorithm;

  tchecker::algorithms::ndfs::stats_t stats = algorithm.run(*zg, *graph, accepting_labels);

  return std::make_tuple(stats, graph);
}